

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_NtkUpdate(Sfm_Ntk_t *p,int iNode,int f,int iFaninNew,word uTruth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vCnf;
  
  iVar1 = Sfm_ObjFanin(p,iNode,f);
  if ((iNode < p->nPis) || (p->nObjs <= p->nPos + iNode)) {
    __assert_fail("Sfm_ObjIsNode(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                  ,0x141,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
  }
  if (iVar1 == iFaninNew) {
    __assert_fail("iFanin != iFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                  ,0x142,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
  }
  iVar2 = Sfm_ObjFaninNum(p,iNode);
  if (iVar2 < 7) {
    if (uTruth + 1 < 2) {
      iVar2 = 0;
      while( true ) {
        iVar3 = Sfm_ObjFaninNum(p,iNode);
        if (iVar3 <= iVar2) break;
        iVar1 = Sfm_ObjFanin(p,iNode,iVar2);
        pVVar4 = Vec_WecEntry(&p->vFanouts,iVar1);
        iVar3 = Vec_IntRemove(pVVar4,iNode);
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                        ,0x148,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
        }
        Sfm_NtkDeleteObj_rec(p,iVar1);
        iVar2 = iVar2 + 1;
      }
      pVVar4 = Vec_WecEntry(&p->vFanins,iNode);
      pVVar4->nSize = 0;
    }
    else {
      Sfm_NtkRemoveFanin(p,iNode,iVar1);
      Sfm_NtkAddFanin(p,iNode,iFaninNew);
      Sfm_NtkDeleteObj_rec(p,iVar1);
    }
    Sfm_NtkUpdateLevel_rec(p,iNode);
    if (iFaninNew != -1) {
      Sfm_NtkUpdateLevelR_rec(p,iFaninNew);
    }
    iVar2 = Sfm_ObjFanoutNum(p,iVar1);
    if (0 < iVar2) {
      Sfm_NtkUpdateLevelR_rec(p,iVar1);
    }
    Vec_WrdWriteEntry(p->vTruths,iNode,uTruth);
    iVar1 = Sfm_ObjFaninNum(p,iNode);
    pVVar4 = p->vCover;
    vCnf = Vec_WecEntry(p->vCnfs,iNode);
    Sfm_TruthToCnf(uTruth,(word *)0x0,iVar1,pVVar4,(Vec_Str_t *)vCnf);
    return;
  }
  __assert_fail("Sfm_ObjFaninNum(p, iNode) <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                ,0x143,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
}

Assistant:

void Sfm_NtkUpdate( Sfm_Ntk_t * p, int iNode, int f, int iFaninNew, word uTruth )
{
    int iFanin = Sfm_ObjFanin( p, iNode, f );
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( iFanin != iFaninNew );
    assert( Sfm_ObjFaninNum(p, iNode) <= 6 );
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Sfm_ObjForEachFanin( p, iNode, iFanin, f )
        {
            int RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );  assert( RetValue );
            Sfm_NtkDeleteObj_rec( p, iFanin );
        }
        Vec_IntClear( Sfm_ObjFiArray(p, iNode) );
    }
    else
    {
        // replace old fanin by new fanin
        Sfm_NtkRemoveFanin( p, iNode, iFanin );
        Sfm_NtkAddFanin( p, iNode, iFaninNew );
        // recursively remove MFFC
        Sfm_NtkDeleteObj_rec( p, iFanin );
    }
    // update logic level
    Sfm_NtkUpdateLevel_rec( p, iNode );
    if ( iFaninNew != -1 )
        Sfm_NtkUpdateLevelR_rec( p, iFaninNew );
    if ( Sfm_ObjFanoutNum(p, iFanin) > 0 )
        Sfm_NtkUpdateLevelR_rec( p, iFanin );
    // update truth table
    Vec_WrdWriteEntry( p->vTruths, iNode, uTruth );
    Sfm_TruthToCnf( uTruth, NULL, Sfm_ObjFaninNum(p, iNode), p->vCover, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode) );
}